

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spherei_intersector.h
# Opt level: O3

bool embree::sse2::SphereMiMBIntersectorK<4,_4,_true>::occluded
               (Precalculations *pre,RayK<4> *ray,size_t k,RayQueryContext *context,
               Primitive *sphere)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  float *pfVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  Scene *pSVar12;
  Geometry *pGVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  bool bVar19;
  bool bVar20;
  bool bVar21;
  byte bVar22;
  int iVar23;
  uint uVar24;
  RTCIntersectArguments *pRVar25;
  RTCFilterFunctionN p_Var26;
  RTCRayN *pRVar27;
  long lVar28;
  ulong uVar29;
  bool bVar30;
  ulong uVar31;
  ulong uVar32;
  ulong uVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar40;
  float fVar41;
  float fVar42;
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  float fVar43;
  float fVar44;
  float fVar53;
  float fVar55;
  float fVar57;
  undefined1 auVar46 [16];
  uint uVar45;
  uint uVar54;
  uint uVar56;
  uint uVar58;
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  float fVar61;
  float fVar62;
  float fVar65;
  float fVar66;
  undefined1 auVar63 [16];
  float fVar67;
  undefined1 auVar64 [16];
  float fVar68;
  float fVar69;
  float fVar70;
  float fVar71;
  float fVar72;
  float fVar73;
  float fVar74;
  float fVar75;
  float fVar76;
  float fVar77;
  float fVar78;
  float fVar79;
  float fVar80;
  float fVar81;
  float fVar82;
  float fVar84;
  undefined1 in_XMM14 [16];
  undefined1 auVar83 [16];
  float fVar85;
  uint uVar86;
  uint uVar87;
  uint uVar88;
  uint uVar89;
  Scene *scene;
  RTCFilterFunctionNArguments args;
  SphereIntersectorHitM<4> hit;
  undefined1 local_208 [16];
  RTCFilterFunctionNArguments local_1f8;
  undefined1 local_1c8 [16];
  undefined1 local_1b8 [8];
  float fStack_1b0;
  float fStack_1ac;
  undefined1 local_1a8 [8];
  float fStack_1a0;
  float fStack_19c;
  undefined1 local_198 [8];
  float fStack_190;
  float fStack_18c;
  undefined1 local_188 [8];
  float fStack_180;
  float fStack_17c;
  uint local_178;
  uint uStack_174;
  uint uStack_170;
  uint uStack_16c;
  undefined1 local_168 [16];
  float local_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  float local_148;
  float fStack_144;
  float fStack_140;
  float fStack_13c;
  float local_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  float local_128;
  float fStack_124;
  float fStack_120;
  float fStack_11c;
  float local_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float local_108;
  float fStack_104;
  float fStack_100;
  float fStack_fc;
  float local_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  undefined1 local_e8 [16];
  uint local_d8 [4];
  undefined1 local_c8 [16];
  undefined1 local_b8 [16];
  undefined1 local_a8 [16];
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined4 local_78;
  undefined4 uStack_74;
  undefined4 uStack_70;
  undefined4 uStack_6c;
  uint local_68;
  uint uStack_64;
  uint uStack_60;
  uint uStack_5c;
  uint local_58;
  uint uStack_54;
  uint uStack_50;
  uint uStack_4c;
  uint local_48;
  uint uStack_44;
  uint uStack_40;
  uint uStack_3c;
  
  pSVar12 = context->scene;
  uVar86 = sphere->sharedGeomID;
  uVar33 = (ulong)(sphere->primIDs).field_0.i[0];
  pGVar13 = (pSVar12->geometries).items[uVar86].ptr;
  fVar43 = pGVar13->fnumTimeSegments;
  fVar34 = (pGVar13->time_range).lower;
  fVar34 = ((*(float *)(ray + k * 4 + 0x70) - fVar34) / ((pGVar13->time_range).upper - fVar34)) *
           fVar43;
  local_1c8 = ZEXT416((uint)fVar34);
  fVar34 = floorf(fVar34);
  fVar43 = fVar43 + -1.0;
  if (fVar43 <= fVar34) {
    fVar34 = fVar43;
  }
  fVar43 = 0.0;
  if (0.0 <= fVar34) {
    fVar43 = fVar34;
  }
  fVar78 = (float)local_1c8._0_4_ - fVar43;
  lVar14 = *(long *)&pGVar13[2].numPrimitives;
  lVar28 = (long)(int)fVar43 * 0x38;
  lVar15 = *(long *)(lVar14 + lVar28);
  lVar16 = *(long *)(lVar14 + 0x10 + lVar28);
  pfVar1 = (float *)(lVar15 + lVar16 * uVar33);
  uVar29 = (ulong)(sphere->primIDs).field_0.i[1];
  pfVar2 = (float *)(lVar15 + lVar16 * uVar29);
  uVar31 = (ulong)(sphere->primIDs).field_0.i[2];
  pfVar3 = (float *)(lVar15 + lVar16 * uVar31);
  uVar32 = (ulong)(sphere->primIDs).field_0.i[3];
  pfVar4 = (float *)(lVar15 + lVar16 * uVar32);
  lVar15 = *(long *)(lVar14 + 0x38 + lVar28);
  lVar14 = *(long *)(lVar14 + 0x48 + lVar28);
  pfVar5 = (float *)(lVar15 + uVar33 * lVar14);
  pfVar6 = (float *)(lVar15 + uVar29 * lVar14);
  pfVar7 = (float *)(lVar15 + uVar31 * lVar14);
  pfVar8 = (float *)(lVar15 + lVar14 * uVar32);
  fVar35 = 1.0 - fVar78;
  fVar36 = fVar35 * pfVar1[3] + fVar78 * pfVar5[3];
  fVar40 = fVar35 * pfVar2[3] + fVar78 * pfVar6[3];
  fVar41 = fVar35 * pfVar3[3] + fVar78 * pfVar7[3];
  fVar42 = fVar35 * pfVar4[3] + fVar78 * pfVar8[3];
  local_1c8._0_8_ = sphere;
  uVar87 = (uint)sphere->numPrimitives;
  local_d8[0] = uVar86;
  local_d8[1] = uVar86;
  local_d8[2] = uVar86;
  local_d8[3] = uVar86;
  fVar43 = *(float *)(ray + k * 4);
  fVar34 = *(float *)(ray + k * 4 + 0x10);
  fVar77 = *(float *)(ray + k * 4 + 0x20);
  fVar71 = (*pfVar1 * fVar35 + *pfVar5 * fVar78) - fVar43;
  fVar72 = (*pfVar2 * fVar35 + *pfVar6 * fVar78) - fVar43;
  fVar73 = (*pfVar3 * fVar35 + *pfVar7 * fVar78) - fVar43;
  fVar43 = (*pfVar4 * fVar35 + *pfVar8 * fVar78) - fVar43;
  fVar68 = (pfVar1[1] * fVar35 + pfVar5[1] * fVar78) - fVar34;
  fVar69 = (pfVar2[1] * fVar35 + pfVar6[1] * fVar78) - fVar34;
  fVar70 = (pfVar3[1] * fVar35 + pfVar7[1] * fVar78) - fVar34;
  fVar34 = (pfVar4[1] * fVar35 + pfVar8[1] * fVar78) - fVar34;
  fVar74 = (pfVar1[2] * fVar35 + pfVar5[2] * fVar78) - fVar77;
  fVar75 = (pfVar2[2] * fVar35 + pfVar6[2] * fVar78) - fVar77;
  fVar76 = (pfVar3[2] * fVar35 + pfVar7[2] * fVar78) - fVar77;
  fVar77 = (pfVar4[2] * fVar35 + pfVar8[2] * fVar78) - fVar77;
  fVar35 = *(float *)(ray + k * 4 + 0x40);
  fVar78 = *(float *)(ray + k * 4 + 0x50);
  fVar79 = *(float *)(ray + k * 4 + 0x60);
  fVar61 = fVar78 * fVar78 + fVar79 * fVar79;
  auVar83._0_4_ = fVar35 * fVar35 + fVar61;
  auVar83._4_4_ = auVar83._0_4_;
  auVar83._8_4_ = auVar83._0_4_;
  auVar83._12_4_ = auVar83._0_4_;
  auVar63 = rcpps(ZEXT416((uint)fVar61),auVar83);
  fVar44 = auVar63._0_4_;
  fVar53 = auVar63._4_4_;
  fVar55 = auVar63._8_4_;
  fVar57 = auVar63._12_4_;
  fVar44 = (1.0 - auVar83._0_4_ * fVar44) * fVar44 + fVar44;
  fVar53 = (1.0 - auVar83._0_4_ * fVar53) * fVar53 + fVar53;
  fVar55 = (1.0 - auVar83._0_4_ * fVar55) * fVar55 + fVar55;
  fVar57 = (1.0 - auVar83._0_4_ * fVar57) * fVar57 + fVar57;
  fVar61 = (fVar71 * fVar35 + fVar68 * fVar78 + fVar74 * fVar79) * fVar44;
  fVar80 = (fVar72 * fVar35 + fVar69 * fVar78 + fVar75 * fVar79) * fVar53;
  fVar81 = (fVar73 * fVar35 + fVar70 * fVar78 + fVar76 * fVar79) * fVar55;
  fVar82 = (fVar43 * fVar35 + fVar34 * fVar78 + fVar77 * fVar79) * fVar57;
  fVar71 = fVar71 - fVar35 * fVar61;
  fVar72 = fVar72 - fVar35 * fVar80;
  fVar73 = fVar73 - fVar35 * fVar81;
  fVar43 = fVar43 - fVar35 * fVar82;
  fVar68 = fVar68 - fVar78 * fVar61;
  fVar69 = fVar69 - fVar78 * fVar80;
  fVar70 = fVar70 - fVar78 * fVar81;
  fVar34 = fVar34 - fVar78 * fVar82;
  fVar74 = fVar74 - fVar79 * fVar61;
  fVar75 = fVar75 - fVar79 * fVar80;
  fVar76 = fVar76 - fVar79 * fVar81;
  fVar77 = fVar77 - fVar79 * fVar82;
  fVar62 = fVar71 * fVar71 + fVar68 * fVar68 + fVar74 * fVar74;
  fVar65 = fVar72 * fVar72 + fVar69 * fVar69 + fVar75 * fVar75;
  fVar66 = fVar73 * fVar73 + fVar70 * fVar70 + fVar76 * fVar76;
  fVar67 = fVar43 * fVar43 + fVar34 * fVar34 + fVar77 * fVar77;
  fVar36 = fVar36 * fVar36;
  fVar40 = fVar40 * fVar40;
  fVar41 = fVar41 * fVar41;
  fVar42 = fVar42 * fVar42;
  bVar20 = uVar87 != 0 && fVar62 <= fVar36;
  auVar63._0_4_ = -(uint)bVar20;
  bVar21 = 1 < uVar87 && fVar65 <= fVar40;
  auVar63._4_4_ = -(uint)bVar21;
  bVar19 = 2 < uVar87 && fVar66 <= fVar41;
  auVar63._8_4_ = -(uint)bVar19;
  bVar30 = 3 < uVar87 && fVar67 <= fVar42;
  auVar63._12_4_ = -(uint)bVar30;
  iVar23 = movmskps(uVar87,auVar63);
  if (iVar23 != 0) {
    auVar46._0_4_ = fVar44 * (fVar36 - fVar62);
    auVar46._4_4_ = fVar53 * (fVar40 - fVar65);
    auVar46._8_4_ = fVar55 * (fVar41 - fVar66);
    auVar46._12_4_ = fVar57 * (fVar42 - fVar67);
    auVar83 = sqrtps(in_XMM14,auVar46);
    fVar55 = auVar83._0_4_;
    fVar41 = fVar61 - fVar55;
    fVar57 = auVar83._4_4_;
    fVar42 = fVar80 - fVar57;
    fVar62 = auVar83._8_4_;
    fVar44 = fVar81 - fVar62;
    fVar65 = auVar83._12_4_;
    fVar53 = fVar82 - fVar65;
    fVar61 = fVar61 + fVar55;
    fVar80 = fVar80 + fVar57;
    fVar81 = fVar81 + fVar62;
    fVar82 = fVar82 + fVar65;
    fVar36 = *(float *)(ray + k * 4 + 0x30);
    fVar40 = *(float *)(ray + k * 4 + 0x80);
    uVar86 = -(uint)(fVar41 <= fVar40 && fVar36 <= fVar41);
    uVar87 = -(uint)(fVar42 <= fVar40 && fVar36 <= fVar42);
    uVar88 = -(uint)(fVar44 <= fVar40 && fVar36 <= fVar44);
    uVar89 = -(uint)(fVar53 <= fVar40 && fVar36 <= fVar53);
    uVar45 = uVar86 & auVar63._0_4_;
    uVar54 = uVar87 & auVar63._4_4_;
    auVar59._4_4_ = uVar54;
    auVar59._0_4_ = uVar45;
    uVar56 = uVar88 & auVar63._8_4_;
    uVar58 = uVar89 & auVar63._12_4_;
    auVar64._0_4_ = -(uint)((fVar36 <= fVar61 && fVar61 <= fVar40) && bVar20);
    auVar64._4_4_ = -(uint)((fVar36 <= fVar80 && fVar80 <= fVar40) && bVar21);
    auVar64._8_4_ = -(uint)((fVar36 <= fVar81 && fVar81 <= fVar40) && bVar19);
    auVar64._12_4_ = -(uint)((fVar36 <= fVar82 && fVar82 <= fVar40) && bVar30);
    auVar59._8_4_ = uVar56;
    auVar59._12_4_ = uVar58;
    uVar24 = movmskps(iVar23,auVar59 | auVar64);
    if (uVar24 != 0) {
      auVar60._0_4_ = ~uVar45 & (uint)fVar61;
      auVar60._4_4_ = ~uVar54 & (uint)fVar80;
      auVar60._8_4_ = ~uVar56 & (uint)fVar81;
      auVar60._12_4_ = ~uVar58 & (uint)fVar82;
      auVar37._0_4_ = (uint)fVar41 & uVar45;
      auVar37._4_4_ = (uint)fVar42 & uVar54;
      auVar37._8_4_ = (uint)fVar44 & uVar56;
      auVar37._12_4_ = (uint)fVar53 & uVar58;
      fVar36 = (float)(~uVar45 & (uint)fVar55 | (uint)-fVar55 & uVar45);
      fVar41 = (float)(~uVar54 & (uint)fVar57 | (uint)-fVar57 & uVar54);
      fVar42 = (float)(~uVar56 & (uint)fVar62 | (uint)-fVar62 & uVar56);
      fVar44 = (float)(~uVar58 & (uint)fVar65 | (uint)-fVar65 & uVar58);
      local_1a8._0_4_ = fVar35 * fVar36 - fVar71;
      local_1a8._4_4_ = fVar35 * fVar41 - fVar72;
      fStack_1a0 = fVar35 * fVar42 - fVar73;
      fStack_19c = fVar35 * fVar44 - fVar43;
      local_198._0_4_ = fVar78 * fVar36 - fVar68;
      local_198._4_4_ = fVar78 * fVar41 - fVar69;
      fStack_190 = fVar78 * fVar42 - fVar70;
      fStack_18c = fVar78 * fVar44 - fVar34;
      local_188._0_4_ = fVar36 * fVar79 - fVar74;
      local_188._4_4_ = fVar41 * fVar79 - fVar75;
      fStack_180 = fVar42 * fVar79 - fVar76;
      fStack_17c = fVar44 * fVar79 - fVar77;
      _local_1b8 = auVar37 | auVar60;
      uVar33 = (ulong)(uVar24 & 0xff);
      auVar63 = _DAT_01f7aa00;
      fVar36 = fVar35;
      fVar41 = fVar35;
      fVar42 = fVar35;
      fVar44 = fVar78;
      fVar53 = fVar78;
      fVar55 = fVar78;
      fVar57 = fVar79;
      fVar62 = fVar79;
      fVar65 = fVar79;
      do {
        local_1f8.hit = (RTCHitN *)local_c8;
        uVar29 = 0;
        if (uVar33 != 0) {
          for (; (uVar33 >> uVar29 & 1) == 0; uVar29 = uVar29 + 1) {
          }
        }
        local_68 = local_d8[uVar29];
        pGVar13 = (pSVar12->geometries).items[local_68].ptr;
        pRVar25 = (RTCIntersectArguments *)(ulong)*(uint *)(ray + k * 4 + 0x90);
        local_1f8.ray = (RTCRayN *)ray;
        if ((pGVar13->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
          pRVar25 = context->args;
          if ((pRVar25->filter == (RTCFilterFunctionN)0x0) &&
             (bVar30 = true, pGVar13->occlusionFilterN == (RTCFilterFunctionN)0x0))
          goto LAB_00ac2c88;
          local_e8 = auVar64;
          *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_1b8 + uVar29 * 4);
          local_1f8.context = context->user;
          local_78 = *(undefined4 *)(local_1c8._0_8_ + 0x10 + uVar29 * 4);
          local_c8._4_4_ = *(undefined4 *)(local_1a8 + uVar29 * 4);
          local_b8._4_4_ = *(undefined4 *)(local_198 + uVar29 * 4);
          local_a8._4_4_ = *(undefined4 *)(local_188 + uVar29 * 4);
          local_c8._0_4_ = local_c8._4_4_;
          local_c8._8_4_ = local_c8._4_4_;
          local_c8._12_4_ = local_c8._4_4_;
          local_b8._0_4_ = local_b8._4_4_;
          local_b8._8_4_ = local_b8._4_4_;
          local_b8._12_4_ = local_b8._4_4_;
          local_a8._0_4_ = local_a8._4_4_;
          local_a8._8_4_ = local_a8._4_4_;
          local_a8._12_4_ = local_a8._4_4_;
          local_88 = 0;
          uStack_80 = 0;
          local_98 = 0;
          uStack_90 = 0;
          uStack_74 = local_78;
          uStack_70 = local_78;
          uStack_6c = local_78;
          uStack_64 = local_68;
          uStack_60 = local_68;
          uStack_5c = local_68;
          uStack_54 = (local_1f8.context)->instID[0];
          local_58 = uStack_54;
          uStack_50 = uStack_54;
          uStack_4c = uStack_54;
          uStack_44 = (local_1f8.context)->instPrimID[0];
          local_48 = uStack_44;
          uStack_40 = uStack_44;
          uStack_3c = uStack_44;
          local_208 = *(undefined1 (*) [16])
                       (mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
          local_1f8.geometryUserPtr = pGVar13->userPtr;
          local_1f8.N = 4;
          p_Var26 = pGVar13->occlusionFilterN;
          local_f8 = fVar68;
          fStack_f4 = fVar69;
          fStack_f0 = fVar70;
          fStack_ec = fVar34;
          local_108 = fVar71;
          fStack_104 = fVar72;
          fStack_100 = fVar73;
          fStack_fc = fVar43;
          local_118 = fVar74;
          fStack_114 = fVar75;
          fStack_110 = fVar76;
          fStack_10c = fVar77;
          local_128 = fVar35;
          fStack_124 = fVar36;
          fStack_120 = fVar41;
          fStack_11c = fVar42;
          local_138 = fVar78;
          fStack_134 = fVar44;
          fStack_130 = fVar53;
          fStack_12c = fVar55;
          local_148 = fVar79;
          fStack_144 = fVar57;
          fStack_140 = fVar62;
          fStack_13c = fVar65;
          local_158 = fVar61;
          fStack_154 = fVar80;
          fStack_150 = fVar81;
          fStack_14c = fVar82;
          local_168 = auVar83;
          local_178 = uVar86;
          uStack_174 = uVar87;
          uStack_170 = uVar88;
          uStack_16c = uVar89;
          local_1f8.valid = (int *)local_208;
          if (p_Var26 != (RTCFilterFunctionN)0x0) {
            p_Var26 = (RTCFilterFunctionN)(*p_Var26)(&local_1f8);
            auVar63 = _DAT_01f7aa00;
          }
          auVar48._8_4_ = 0xffffffff;
          auVar48._0_8_ = 0xffffffffffffffff;
          auVar48._12_4_ = 0xffffffff;
          auVar47._0_4_ = -(uint)(local_208._0_4_ == 0);
          auVar47._4_4_ = -(uint)(local_208._4_4_ == 0);
          auVar47._8_4_ = -(uint)(local_208._8_4_ == 0);
          auVar47._12_4_ = -(uint)(local_208._12_4_ == 0);
          uVar86 = movmskps((int)p_Var26,auVar47);
          pRVar27 = (RTCRayN *)(ulong)(uVar86 ^ 0xf);
          if ((uVar86 ^ 0xf) == 0) {
            auVar48 = auVar47 ^ auVar48;
          }
          else {
            p_Var26 = context->args->filter;
            if ((p_Var26 != (RTCFilterFunctionN)0x0) &&
               (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                 RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar13->field_8).field_0x2 & 0x40) != 0)))) {
              (*p_Var26)(&local_1f8);
              auVar48._8_4_ = 0xffffffff;
              auVar48._0_8_ = 0xffffffffffffffff;
              auVar48._12_4_ = 0xffffffff;
              auVar63 = _DAT_01f7aa00;
            }
            auVar38._0_4_ = -(uint)(local_208._0_4_ == 0);
            auVar38._4_4_ = -(uint)(local_208._4_4_ == 0);
            auVar38._8_4_ = -(uint)(local_208._8_4_ == 0);
            auVar38._12_4_ = -(uint)(local_208._12_4_ == 0);
            auVar48 = auVar38 ^ auVar48;
            *(undefined1 (*) [16])(local_1f8.ray + 0x80) =
                 ~auVar38 & auVar63 | *(undefined1 (*) [16])(local_1f8.ray + 0x80) & auVar38;
            pRVar27 = local_1f8.ray;
          }
          auVar49._0_4_ = auVar48._0_4_ << 0x1f;
          auVar49._4_4_ = auVar48._4_4_ << 0x1f;
          auVar49._8_4_ = auVar48._8_4_ << 0x1f;
          auVar49._12_4_ = auVar48._12_4_ << 0x1f;
          uVar24 = movmskps((int)pRVar27,auVar49);
          pRVar25 = (RTCIntersectArguments *)(ulong)uVar24;
          auVar64 = local_e8;
          fVar68 = local_f8;
          fVar69 = fStack_f4;
          fVar70 = fStack_f0;
          fVar34 = fStack_ec;
          fVar71 = local_108;
          fVar72 = fStack_104;
          fVar73 = fStack_100;
          fVar43 = fStack_fc;
          fVar74 = local_118;
          fVar75 = fStack_114;
          fVar76 = fStack_110;
          fVar77 = fStack_10c;
          fVar35 = local_128;
          fVar36 = fStack_124;
          fVar41 = fStack_120;
          fVar42 = fStack_11c;
          fVar78 = local_138;
          fVar44 = fStack_134;
          fVar53 = fStack_130;
          fVar55 = fStack_12c;
          fVar79 = local_148;
          fVar57 = fStack_144;
          fVar62 = fStack_140;
          fVar65 = fStack_13c;
          fVar61 = local_158;
          fVar80 = fStack_154;
          fVar81 = fStack_150;
          fVar82 = fStack_14c;
          auVar83 = local_168;
          uVar86 = local_178;
          uVar87 = uStack_174;
          uVar88 = uStack_170;
          uVar89 = uStack_16c;
          if (uVar24 != 0) {
            fVar40 = *(float *)(ray + k * 4 + 0x80);
            bVar30 = true;
            goto LAB_00ac2c88;
          }
          *(float *)(ray + k * 4 + 0x80) = fVar40;
        }
        uVar33 = uVar33 ^ 1L << (uVar29 & 0x3f);
      } while (uVar33 != 0);
      bVar30 = false;
LAB_00ac2c88:
      auVar18._4_4_ = uVar87 & -(uint)(fVar80 <= fVar40) & auVar64._4_4_;
      auVar18._0_4_ = uVar86 & -(uint)(fVar61 <= fVar40) & auVar64._0_4_;
      auVar18._8_4_ = uVar88 & -(uint)(fVar81 <= fVar40) & auVar64._8_4_;
      auVar18._12_4_ = uVar89 & -(uint)(fVar82 <= fVar40) & auVar64._12_4_;
      uVar86 = movmskps((int)pRVar25,auVar18);
      if (uVar86 == 0) {
        return bVar30;
      }
      fVar66 = auVar83._0_4_;
      fVar67 = auVar83._4_4_;
      fVar84 = auVar83._8_4_;
      fVar85 = auVar83._12_4_;
      local_1b8._4_4_ = fVar80;
      local_1b8._0_4_ = fVar61;
      fStack_1b0 = fVar81;
      fStack_1ac = fVar82;
      local_1a8._4_4_ = fVar36 * fVar67 - fVar72;
      local_1a8._0_4_ = fVar35 * fVar66 - fVar71;
      fStack_1a0 = fVar41 * fVar84 - fVar73;
      fStack_19c = fVar42 * fVar85 - fVar43;
      local_198._4_4_ = fVar44 * fVar67 - fVar69;
      local_198._0_4_ = fVar78 * fVar66 - fVar68;
      fStack_190 = fVar53 * fVar84 - fVar70;
      fStack_18c = fVar55 * fVar85 - fVar34;
      local_188._4_4_ = fVar57 * fVar67 - fVar75;
      local_188._0_4_ = fVar79 * fVar66 - fVar74;
      fStack_180 = fVar62 * fVar84 - fVar76;
      fStack_17c = fVar65 * fVar85 - fVar77;
      pSVar12 = context->scene;
      uVar33 = (ulong)(uVar86 & 0xff);
      do {
        local_1f8.hit = (RTCHitN *)local_c8;
        local_1f8.valid = (int *)local_208;
        uVar29 = 0;
        if (uVar33 != 0) {
          for (; (uVar33 >> uVar29 & 1) == 0; uVar29 = uVar29 + 1) {
          }
        }
        local_68 = local_d8[uVar29];
        pGVar13 = (pSVar12->geometries).items[local_68].ptr;
        if ((pGVar13->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
          if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
             (bVar22 = 1, pGVar13->occlusionFilterN == (RTCFilterFunctionN)0x0)) goto LAB_00ac2f63;
          *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_1b8 + uVar29 * 4);
          local_1f8.context = context->user;
          local_78 = *(undefined4 *)(local_1c8._0_8_ + 0x10 + uVar29 * 4);
          uVar9 = *(undefined4 *)(local_1a8 + uVar29 * 4);
          uVar10 = *(undefined4 *)(local_198 + uVar29 * 4);
          uVar11 = *(undefined4 *)(local_188 + uVar29 * 4);
          local_c8._4_4_ = uVar9;
          local_c8._0_4_ = uVar9;
          local_c8._8_4_ = uVar9;
          local_c8._12_4_ = uVar9;
          local_b8._4_4_ = uVar10;
          local_b8._0_4_ = uVar10;
          local_b8._8_4_ = uVar10;
          local_b8._12_4_ = uVar10;
          local_a8._4_4_ = uVar11;
          local_a8._0_4_ = uVar11;
          local_a8._8_4_ = uVar11;
          local_a8._12_4_ = uVar11;
          local_88 = 0;
          uStack_80 = 0;
          local_98 = 0;
          uStack_90 = 0;
          uStack_74 = local_78;
          uStack_70 = local_78;
          uStack_6c = local_78;
          uStack_64 = local_68;
          uStack_60 = local_68;
          uStack_5c = local_68;
          uStack_54 = (local_1f8.context)->instID[0];
          local_58 = uStack_54;
          uStack_50 = uStack_54;
          uStack_4c = uStack_54;
          uStack_44 = (local_1f8.context)->instPrimID[0];
          local_48 = uStack_44;
          uStack_40 = uStack_44;
          uStack_3c = uStack_44;
          local_208 = *(undefined1 (*) [16])
                       (mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
          local_1f8.geometryUserPtr = pGVar13->userPtr;
          local_1f8.N = 4;
          p_Var26 = pGVar13->occlusionFilterN;
          local_1f8.ray = (RTCRayN *)ray;
          if (p_Var26 != (RTCFilterFunctionN)0x0) {
            p_Var26 = (RTCFilterFunctionN)(*p_Var26)(&local_1f8);
            auVar63 = _DAT_01f7aa00;
          }
          auVar50._0_4_ = -(uint)(local_208._0_4_ == 0);
          auVar50._4_4_ = -(uint)(local_208._4_4_ == 0);
          auVar50._8_4_ = -(uint)(local_208._8_4_ == 0);
          auVar50._12_4_ = -(uint)(local_208._12_4_ == 0);
          uVar86 = movmskps((int)p_Var26,auVar50);
          pRVar27 = (RTCRayN *)(ulong)(uVar86 ^ 0xf);
          if ((uVar86 ^ 0xf) == 0) {
            auVar17._8_4_ = 0xffffffff;
            auVar17._0_8_ = 0xffffffffffffffff;
            auVar17._12_4_ = 0xffffffff;
            auVar51 = auVar50 ^ auVar17;
          }
          else {
            p_Var26 = context->args->filter;
            if ((p_Var26 != (RTCFilterFunctionN)0x0) &&
               (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                 RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar13->field_8).field_0x2 & 0x40) != 0)))) {
              (*p_Var26)(&local_1f8);
              auVar63 = _DAT_01f7aa00;
            }
            auVar39._0_4_ = -(uint)(local_208._0_4_ == 0);
            auVar39._4_4_ = -(uint)(local_208._4_4_ == 0);
            auVar39._8_4_ = -(uint)(local_208._8_4_ == 0);
            auVar39._12_4_ = -(uint)(local_208._12_4_ == 0);
            auVar51._8_4_ = 0xffffffff;
            auVar51._0_8_ = 0xffffffffffffffff;
            auVar51._12_4_ = 0xffffffff;
            auVar51 = auVar39 ^ auVar51;
            *(undefined1 (*) [16])(local_1f8.ray + 0x80) =
                 ~auVar39 & auVar63 | *(undefined1 (*) [16])(local_1f8.ray + 0x80) & auVar39;
            pRVar27 = local_1f8.ray;
          }
          auVar52._0_4_ = auVar51._0_4_ << 0x1f;
          auVar52._4_4_ = auVar51._4_4_ << 0x1f;
          auVar52._8_4_ = auVar51._8_4_ << 0x1f;
          auVar52._12_4_ = auVar51._12_4_ << 0x1f;
          iVar23 = movmskps((int)pRVar27,auVar52);
          if (iVar23 != 0) {
            bVar22 = 1;
            goto LAB_00ac2f63;
          }
          *(float *)(ray + k * 4 + 0x80) = fVar40;
        }
        uVar33 = uVar33 ^ 1L << (uVar29 & 0x3f);
        if (uVar33 == 0) {
          bVar22 = 0;
LAB_00ac2f63:
          return (bool)(bVar30 | bVar22);
        }
      } while( true );
    }
  }
  return false;
}

Assistant:

static __forceinline bool occluded(
          const Precalculations& pre, RayK<K>& ray, size_t k, RayQueryContext* context, const Primitive& sphere)
      {
        STAT3(shadow.trav_prims, 1, 1, 1);
        const Points* geom = context->scene->get<Points>(sphere.geomID());
        Vec4vf<M> v0; sphere.gather(v0, geom, ray.time()[k]);
        const vbool<M> valid = sphere.valid();
        return SphereIntersectorK<M, K>::intersect(
          valid, ray, k, context, geom, pre, v0,
          Occluded1KEpilogM<M, K, filter>(ray, k, context, sphere.geomID(), sphere.primID()));
      }